

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

void gauden_norm_wt_mmie_var
               (vector_t ***in_var,vector_t ***wt_var,vector_t ***wt_num_var,vector_t ***wt_den_var,
               float32 ***num_dnom,float32 ***den_dnom,vector_t ***in_mean,vector_t ***wt_mean,
               vector_t ***wt_num_mean,vector_t ***wt_den_mean,uint32 n_mgau,uint32 n_feat,
               uint32 n_density,uint32 *veclen,float32 constE)

{
  float den_dnom_00;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  float32 fVar6;
  float fVar7;
  
  uVar5 = 0;
  do {
    if (uVar5 == n_mgau) {
      return;
    }
    for (uVar4 = 0; uVar4 != n_feat; uVar4 = uVar4 + 1) {
      for (uVar3 = 0; uVar3 != n_density; uVar3 = uVar3 + 1) {
        fVar7 = (float)num_dnom[uVar5][uVar4][uVar3];
        den_dnom_00 = (float)den_dnom[uVar5][uVar4][uVar3];
        if ((((fVar7 != 0.0) || (NAN(fVar7))) || (den_dnom_00 != 0.0)) || (NAN(den_dnom_00))) {
          fVar6 = cal_constD(in_mean[uVar5][uVar4][uVar3],wt_num_mean[uVar5][uVar4][uVar3],
                             wt_den_mean[uVar5][uVar4][uVar3],in_var[uVar5][uVar4][uVar3],
                             wt_num_var[uVar5][uVar4][uVar3],wt_den_var[uVar5][uVar4][uVar3],
                             (float32)fVar7,(float32)den_dnom_00,veclen[uVar4],constE);
          if ((uint)ABS((float)fVar6) < 0x7f800000) {
            for (uVar2 = 0; uVar2 < veclen[uVar4]; uVar2 = uVar2 + 1) {
              fVar7 = ((in_mean[uVar5][uVar4][uVar3][uVar2] * in_mean[uVar5][uVar4][uVar3][uVar2] +
                       in_var[uVar5][uVar4][uVar3][uVar2]) * (float)fVar6 +
                      (wt_num_var[uVar5][uVar4][uVar3][uVar2] -
                      wt_den_var[uVar5][uVar4][uVar3][uVar2])) /
                      (((float)num_dnom[uVar5][uVar4][uVar3] - (float)den_dnom[uVar5][uVar4][uVar3])
                      + (float)fVar6) -
                      wt_mean[uVar5][uVar4][uVar3][uVar2] * wt_mean[uVar5][uVar4][uVar3][uVar2];
              wt_var[uVar5][uVar4][uVar3][uVar2] = fVar7;
              if ((uint)ABS(fVar7) < 0x7f800000) {
                if (fVar7 < 0.0) {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x870,
                          "Variance of the senone (mgau= %u, feat= %u, density=%u, component=%u) < 0\n"
                          ,uVar5 & 0xffffffff,uVar4 & 0xffffffff,uVar3,uVar2);
                  goto LAB_00113d2e;
                }
              }
              else {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                        ,0x869,
                        "The new variance:%f (gau:%d feat:%d density:%d vec:%d) is infinite, maybe unsufficient data\n"
                        ,SUB84((double)fVar7,0),uVar5 & 0xffffffff,uVar4 & 0xffffffff,uVar3,uVar2);
LAB_00113d2e:
                wt_var[uVar5][uVar4][uVar3][uVar2] = in_var[uVar5][uVar4][uVar3][uVar2];
              }
            }
          }
          else {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x85b,
                    "Constant D:%f (gau:%d feat:%d density:%d) is infinite, maybe unsufficient data\n"
                    ,SUB84((double)(float)fVar6,0),uVar5 & 0xffffffff,uVar4 & 0xffffffff,uVar3);
            uVar1 = veclen[uVar4];
            for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
              wt_var[uVar5][uVar4][uVar3][uVar2] = in_var[uVar5][uVar4][uVar3][uVar2];
            }
          }
        }
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void
gauden_norm_wt_mmie_var(vector_t ***in_var,
			vector_t ***wt_var,
			vector_t ***wt_num_var,
			vector_t ***wt_den_var,
			float32 ***num_dnom,
			float32 ***den_dnom,
			vector_t ***in_mean,
			vector_t ***wt_mean,
			vector_t ***wt_num_mean,
			vector_t ***wt_den_mean,
			uint32 n_mgau,
			uint32 n_feat,
			uint32 n_density,
			const uint32 *veclen,
			float32 constE)
{
    uint32 i, j, k, l;
    float32 d_mmi = 0.0;
    
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (num_dnom[i][j][k] != 0 || den_dnom[i][j][k] != 0) {
		        
		    /* compute constant D, which controls the convergence speed and accuracy */
		    d_mmi = cal_constD(in_mean[i][j][k], wt_num_mean[i][j][k], wt_den_mean[i][j][k],
				       in_var[i][j][k], wt_num_var[i][j][k], wt_den_var[i][j][k], num_dnom[i][j][k], den_dnom[i][j][k], veclen[j], constE);
		    if (!finite(d_mmi)) {
			E_ERROR("Constant D:%f (gau:%d feat:%d density:%d) is infinite, maybe unsufficient data\n", d_mmi, i, j, k);
    			for (l = 0; l < veclen[j]; l++) {
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
    			}
			continue;
		    }
		        
		    /* update variance parameters */
		    for (l = 0; l < veclen[j]; l++) {
			wt_var[i][j][k][l] = ((wt_num_var[i][j][k][l] - wt_den_var[i][j][k][l]) + 
					      d_mmi * (in_var[i][j][k][l] + in_mean[i][j][k][l] * in_mean[i][j][k][l])) / 
			    (num_dnom[i][j][k] - den_dnom[i][j][k] + d_mmi)
			    - (wt_mean[i][j][k][l] * wt_mean[i][j][k][l]);
			if (!finite(wt_var[i][j][k][l])) {
			    E_ERROR("The new variance:%f (gau:%d feat:%d density:%d vec:%d) is infinite, maybe unsufficient data\n", wt_var[i][j][k][l], i, j, k, l);
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			    continue;
			}
			
			/* if the new var<0, keep it unchanged */
			if (wt_var[i][j][k][l] < 0) {
			    E_ERROR("Variance of the senone (mgau= %u, feat= %u, ""density=%u, component=%u) < 0\n", i, j, k, l);
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			}
		    }
		}
	    }
	}
    }
}